

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

anon_unknown_dwarf_28c33 * __thiscall
anon_unknown.dwarf_28c33::openFile(anon_unknown_dwarf_28c33 *this,string *fileName)

{
  ostream *poVar1;
  
  std::ifstream::ifstream(this);
  std::ifstream::open((string *)this,(_Ios_Openmode)fileName);
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 5) == 0) {
    return this;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Can\'t open file ");
  poVar1 = std::operator<<(poVar1,(string *)fileName);
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

ifstream openFile(const string & fileName) {
        ifstream fileStream;
        fileStream.open(fileName, fstream::in);
        if (fileStream.fail()) {
            cout << "Can't open file " << fileName << endl;
            exit(1);
        }
        return fileStream;
    }